

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void gen_exception_internal(TCGContext_conflict1 *tcg_ctx,int excp)

{
  _Bool _Var1;
  TCGv_i32 arg2;
  TCGv_i32 tcg_excp;
  int excp_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  arg2 = tcg_const_i32_aarch64(tcg_ctx,excp);
  _Var1 = excp_is_internal(excp);
  if (!_Var1) {
    __assert_fail("excp_is_internal(excp)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x10c,"void gen_exception_internal(TCGContext *, int)");
  }
  gen_helper_exception_internal(tcg_ctx,tcg_ctx->cpu_env,arg2);
  tcg_temp_free_i32(tcg_ctx,arg2);
  return;
}

Assistant:

static void gen_exception_internal(TCGContext *tcg_ctx, int excp)
{
    TCGv_i32 tcg_excp = tcg_const_i32(tcg_ctx, excp);

    assert(excp_is_internal(excp));
    gen_helper_exception_internal(tcg_ctx, tcg_ctx->cpu_env, tcg_excp);
    tcg_temp_free_i32(tcg_ctx, tcg_excp);
}